

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int uv__signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum,int oneshot)

{
  byte *pbVar1;
  uint *puVar2;
  uint uVar3;
  uv_signal_s *puVar4;
  uv_signal_t *puVar5;
  uv_signal_s *puVar6;
  int iVar7;
  uv_signal_t *puVar8;
  uv_signal_s *puVar9;
  uv_signal_t *puVar10;
  uv__signal_tree_s *puVar11;
  long lVar12;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar13;
  uv_signal_s *puVar14;
  sigset_t saved_sigmask;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!uv__is_closing(handle)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/signal.c"
                  ,0x16f,"int uv__signal_start(uv_signal_t *, uv_signal_cb, int, int)");
  }
  if (signum == 0) {
    return -0x16;
  }
  if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }
  uv__signal_block_and_lock(&saved_sigmask);
  puVar8 = uv__signal_first_handle(signum);
  if (puVar8 == (uv_signal_t *)0x0) {
LAB_00407468:
    iVar7 = uv__signal_register_handler(signum,oneshot);
    if (iVar7 != 0) {
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return iVar7;
    }
    handle->signum = signum;
    if (oneshot == 0) goto LAB_00407494;
  }
  else {
    if (oneshot == 0) {
      if ((puVar8->flags & 0x2000000) == 0) {
        handle->signum = signum;
        goto LAB_00407494;
      }
      goto LAB_00407468;
    }
    handle->signum = signum;
  }
  pbVar1 = (byte *)((long)&handle->flags + 3);
  *pbVar1 = *pbVar1 | 2;
LAB_00407494:
  iVar7 = 0;
  puVar11 = &uv__signal_tree;
  puVar9 = (uv_signal_t *)0x0;
  while (puVar8 = puVar11->rbh_root, puVar8 != (uv_signal_t *)0x0) {
    iVar7 = uv__signal_compare(handle,puVar8);
    lVar12 = 0x70;
    if ((-1 < iVar7) && (lVar12 = 0x78, iVar7 == 0)) goto LAB_00407744;
    puVar9 = puVar8;
    puVar11 = (uv__signal_tree_s *)((long)puVar8->handle_queue + lVar12 + -0x20);
  }
  (handle->tree_entry).rbe_parent = puVar9;
  (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
  (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
  (handle->tree_entry).rbe_color = 1;
  puVar11 = &uv__signal_tree;
  if (puVar9 != (uv_signal_t *)0x0) {
    if (iVar7 < 0) {
      puVar11 = (uv__signal_tree_s *)&puVar9->tree_entry;
    }
    else {
      puVar11 = (uv__signal_tree_s *)&(puVar9->tree_entry).rbe_right;
    }
  }
  ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar11)->rbe_left = handle;
  puVar8 = handle;
  do {
    if ((puVar9 == (uv_signal_t *)0x0) || ((puVar9->tree_entry).rbe_color != 1)) {
      ((uv__signal_tree.rbh_root)->tree_entry).rbe_color = 0;
LAB_00407744:
      uv__signal_unlock_and_unblock(&saved_sigmask);
      handle->signal_cb = signal_cb;
      uVar3 = handle->flags;
      if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
        puVar2 = &handle->loop->active_handles;
        *puVar2 = *puVar2 + 1;
      }
      return 0;
    }
    puVar4 = (puVar9->tree_entry).rbe_parent;
    puVar14 = (puVar4->tree_entry).rbe_left;
    puVar10 = puVar8;
    if (puVar9 == puVar14) {
      puVar6 = (puVar4->tree_entry).rbe_right;
      if ((puVar6 != (uv_signal_s *)0x0) && ((puVar6->tree_entry).rbe_color == 1)) {
        (puVar6->tree_entry).rbe_color = 0;
        goto LAB_00407579;
      }
      puVar5 = (puVar9->tree_entry).rbe_right;
      if (puVar5 == puVar8) {
        puVar14 = (puVar5->tree_entry).rbe_left;
        (puVar9->tree_entry).rbe_right = puVar14;
        if (puVar14 == (uv_signal_s *)0x0) {
          (puVar5->tree_entry).rbe_parent = puVar4;
          puVar14 = (puVar9->tree_entry).rbe_parent;
LAB_004076a8:
          puVar11 = (uv__signal_tree_s *)&(puVar14->tree_entry).rbe_right;
          if (puVar9 == (puVar14->tree_entry).rbe_left) {
            puVar11 = (uv__signal_tree_s *)&puVar14->tree_entry;
          }
        }
        else {
          (puVar14->tree_entry).rbe_parent = puVar9;
          puVar14 = (puVar9->tree_entry).rbe_parent;
          (puVar5->tree_entry).rbe_parent = puVar14;
          puVar11 = &uv__signal_tree;
          if (puVar14 != (uv_signal_s *)0x0) goto LAB_004076a8;
        }
        ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar11)->rbe_left = puVar5;
        (puVar5->tree_entry).rbe_left = puVar9;
        (puVar9->tree_entry).rbe_parent = puVar5;
        puVar14 = (puVar4->tree_entry).rbe_left;
        puVar10 = puVar9;
        puVar9 = puVar8;
      }
      (puVar9->tree_entry).rbe_color = 0;
      (puVar4->tree_entry).rbe_color = 1;
      puVar9 = (puVar14->tree_entry).rbe_right;
      (puVar4->tree_entry).rbe_left = puVar9;
      if (puVar9 != (uv_signal_s *)0x0) {
        (puVar9->tree_entry).rbe_parent = puVar4;
      }
      puVar9 = (puVar4->tree_entry).rbe_parent;
      (puVar14->tree_entry).rbe_parent = puVar9;
      paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar9 != (uv_signal_s *)0x0) {
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar9->tree_entry).rbe_right;
        if (puVar4 == (puVar9->tree_entry).rbe_left) {
          paVar13 = &puVar9->tree_entry;
        }
      }
      paVar13->rbe_left = puVar14;
      (puVar14->tree_entry).rbe_right = puVar4;
      (puVar4->tree_entry).rbe_parent = puVar14;
    }
    else if ((puVar14 == (uv_signal_s *)0x0) || ((puVar14->tree_entry).rbe_color != 1)) {
      puVar5 = (puVar9->tree_entry).rbe_left;
      if (puVar5 == puVar8) {
        puVar14 = (puVar5->tree_entry).rbe_right;
        (puVar9->tree_entry).rbe_left = puVar14;
        if (puVar14 == (uv_signal_s *)0x0) {
          (puVar5->tree_entry).rbe_parent = puVar4;
          puVar14 = (puVar9->tree_entry).rbe_parent;
LAB_00407617:
          puVar11 = (uv__signal_tree_s *)&(puVar14->tree_entry).rbe_right;
          if (puVar9 == (puVar14->tree_entry).rbe_left) {
            puVar11 = (uv__signal_tree_s *)&puVar14->tree_entry;
          }
        }
        else {
          (puVar14->tree_entry).rbe_parent = puVar9;
          puVar14 = (puVar9->tree_entry).rbe_parent;
          (puVar5->tree_entry).rbe_parent = puVar14;
          puVar11 = &uv__signal_tree;
          if (puVar14 != (uv_signal_s *)0x0) goto LAB_00407617;
        }
        ((anon_struct_32_4_548b78d9_for_tree_entry *)puVar11)->rbe_left = puVar5;
        (puVar5->tree_entry).rbe_right = puVar9;
        (puVar9->tree_entry).rbe_parent = puVar5;
        puVar10 = puVar9;
        puVar9 = puVar8;
      }
      (puVar9->tree_entry).rbe_color = 0;
      (puVar4->tree_entry).rbe_color = 1;
      puVar9 = (puVar4->tree_entry).rbe_right;
      puVar14 = (puVar9->tree_entry).rbe_left;
      (puVar4->tree_entry).rbe_right = puVar14;
      if (puVar14 != (uv_signal_s *)0x0) {
        (puVar14->tree_entry).rbe_parent = puVar4;
      }
      puVar14 = (puVar4->tree_entry).rbe_parent;
      (puVar9->tree_entry).rbe_parent = puVar14;
      paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar14 != (uv_signal_s *)0x0) {
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar14->tree_entry).rbe_right;
        if (puVar4 == (puVar14->tree_entry).rbe_left) {
          paVar13 = &puVar14->tree_entry;
        }
      }
      paVar13->rbe_left = puVar9;
      (puVar9->tree_entry).rbe_left = puVar4;
      (puVar4->tree_entry).rbe_parent = puVar9;
    }
    else {
      (puVar14->tree_entry).rbe_color = 0;
LAB_00407579:
      (puVar9->tree_entry).rbe_color = 0;
      (puVar4->tree_entry).rbe_color = 1;
      puVar10 = puVar4;
    }
    puVar9 = (puVar10->tree_entry).rbe_parent;
    puVar8 = puVar10;
  } while( true );
}

Assistant:

static int uv__signal_start(uv_signal_t* handle,
                            uv_signal_cb signal_cb,
                            int signum,
                            int oneshot) {
  sigset_t saved_sigmask;
  int err;
  uv_signal_t* first_handle;

  assert(!uv__is_closing(handle));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return UV_EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small time
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   * Also in case there's only one-shot handlers and a regular handler comes in.
   */
  first_handle = uv__signal_first_handle(signum);
  if (first_handle == NULL ||
      (!oneshot && (first_handle->flags & UV_SIGNAL_ONE_SHOT))) {
    err = uv__signal_register_handler(signum, oneshot);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  if (oneshot)
    handle->flags |= UV_SIGNAL_ONE_SHOT;

  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}